

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O2

void __thiscall raspicam::_private::Private_Impl_Still::commitSaturation(Private_Impl_Still *this)

{
  MMAL_STATUS_T MVar1;
  ostream *poVar2;
  
  MVar1 = mmal_port_parameter_set_rational
                    (this->camera->control,0x1002f,
                     (MMAL_RATIONAL_T)((ulong)(uint)this->saturation | 0x6400000000));
  if (MVar1 != MMAL_SUCCESS) {
    poVar2 = std::operator<<((ostream *)&std::cout,this->API_NAME);
    std::operator<<(poVar2,": Failed to set saturation parameter.\n");
    return;
  }
  return;
}

Assistant:

void Private_Impl_Still::commitSaturation() {
            if ( mmal_port_parameter_set_rational ( camera->control, MMAL_PARAMETER_SATURATION, ( MMAL_RATIONAL_T ) {
            saturation, 100
        } ) != MMAL_SUCCESS )
            cout << API_NAME << ": Failed to set saturation parameter.\n";
        }